

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsClosed(ON_PolyCurve *this)

{
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  bool local_29;
  ON_Curve *c;
  int count;
  bool bIsClosed;
  ON_PolyCurve *this_local;
  
  c._7_1_ = false;
  iVar2 = Count(this);
  if (iVar2 == 1) {
    pOVar3 = FirstSegmentCurve(this);
    if (pOVar3 != (ON_Curve *)0x0) {
      iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      c._7_1_ = (bool)((byte)iVar2 & 1);
    }
  }
  else if (1 < iVar2) {
    bVar1 = ON_Curve::IsClosed(&this->super_ON_Curve);
    local_29 = false;
    if (bVar1) {
      iVar2 = FindNextGap(this,0);
      local_29 = iVar2 < 1;
    }
    c._7_1_ = local_29;
  }
  return c._7_1_;
}

Assistant:

bool 
ON_PolyCurve::IsClosed() const
{
  bool bIsClosed = false;
  const int count = Count();
  if ( count == 1 ) {
    // evaluation test required
    const ON_Curve* c = FirstSegmentCurve();
    if ( c )
      bIsClosed = c->IsClosed();
  }
  else if ( count > 1 ) 
  {
    // 17 May2005 Dale Lear 
    //  I added the FindNextGap(0) <= 0 test to
    //  prevent discontinuous curves from being
    //  classified as closed.
    bIsClosed = ( ON_Curve::IsClosed() && FindNextGap(0) <= 0 );
  }
  return bIsClosed;
}